

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void TPZSkylMatrix<std::complex<long_double>_>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<std::complex<long_double>_> *storage,
               TPZVec<std::complex<long_double>_*> *point)

{
  long lVar1;
  int64_t index;
  int64_t iVar2;
  complex<long_double> *pcVar3;
  complex<long_double> **ppcVar4;
  long *plVar5;
  TPZVec<std::complex<long_double>_*> *in_RDX;
  TPZVec<std::complex<long_double>_> *in_RSI;
  TPZVec<long> *in_RDI;
  int64_t i;
  int64_t nel;
  int64_t dim;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  TPZVec<std::complex<long_double>_> *numelem;
  int64_t in_stack_ffffffffffffffb0;
  long lVar6;
  long index_00;
  complex<long_double> *in_stack_ffffffffffffffb8;
  TPZVec<std::complex<long_double>_> *in_stack_ffffffffffffffc0;
  
  index = TPZVec<long>::NElements(in_RDI);
  iVar2 = NumElements((TPZVec<long> *)CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80))
  ;
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,iVar2);
  numelem = in_RSI;
  std::complex<long_double>::complex
            ((complex<long_double> *)&stack0xffffffffffffffb8,(longdouble)0,(longdouble)0);
  TPZVec<std::complex<long_double>_>::Fill
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (int64_t)numelem);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,index + 1);
  if (index == 0) {
    ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[](in_RDX,0);
    *ppcVar4 = (complex<long_double> *)0x0;
  }
  else {
    pcVar3 = TPZVec<std::complex<long_double>_>::operator[](in_RSI,0);
    ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[](in_RDX,0);
    *ppcVar4 = pcVar3;
    pcVar3 = TPZVec<std::complex<long_double>_>::operator[](in_RSI,0);
    ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[](in_RDX,index);
    *ppcVar4 = pcVar3 + iVar2;
  }
  lVar6 = 1;
  while (lVar6 < index + 1) {
    ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[](in_RDX,lVar6 + -1);
    pcVar3 = *ppcVar4;
    index_00 = lVar6;
    plVar5 = TPZVec<long>::operator[](in_RDI,lVar6 + -1);
    lVar1 = *plVar5;
    ppcVar4 = TPZVec<std::complex<long_double>_*>::operator[](in_RDX,index_00);
    *ppcVar4 = pcVar3 + (lVar6 - lVar1);
    lVar6 = index_00 + 1;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}